

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_connect.cpp
# Opt level: O2

void __thiscall tst_helpers_connect::resolveOneSenderManyArgs(tst_helpers_connect *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar2;
  char cVar3;
  bool bVar4;
  QThread *p_00;
  QObject *pQVar5;
  QEvent *this_00;
  PromiseData<void> *this_01;
  undefined8 uVar6;
  char *reject;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_d8;
  PromiseResolver<void> resolver;
  int value;
  QPromiseBase<void> local_c0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_b0;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a0;
  PromiseFromSignal<void_(Object::*)(int,_const_QString_&)> p;
  QPromiseBase<void> local_88;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  _Any_data local_50;
  int *local_40;
  Object sender;
  
  Object::Object(&sender);
  p_00 = (QThread *)QThread::currentThread();
  QPointer<QThread>::QPointer((QPointer<QThread> *)&local_78,p_00);
  if ((((Data *)local_78._M_unused._0_8_ != (Data *)0x0) &&
      ((QThread *)local_78._8_8_ != (QThread *)0x0 &&
       *(int *)(local_78._M_unused._M_function_pointer + 4) != 0)) &&
     (cVar3 = QThread::isFinished(), cVar3 == '\0')) {
    if (((Data *)local_78._M_unused._0_8_ == (Data *)0x0) ||
       (uVar6 = local_78._8_8_, *(int *)(local_78._M_unused._M_function_pointer + 4) == 0)) {
      uVar6 = (QThread *)0x0;
    }
    pQVar5 = (QObject *)QAbstractEventDispatcher::instance((QThread *)uVar6);
    if ((pQVar5 != (QObject *)0x0) || (cVar3 = QCoreApplication::closingDown(), cVar3 == '\0')) {
      this_00 = (QEvent *)operator_new(0x18);
      QEvent::QEvent(this_00,None);
      *(undefined ***)this_00 = &PTR__Event_001272a0;
      *(Object **)(this_00 + 0x10) = &sender;
      QCoreApplication::postEvent(pQVar5,this_00,0);
    }
  }
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)&local_78);
  QtPromise::connect<Object,void(Object::*)(int,QString_const&)>
            ((Object *)&p,(offset_in_Object_to_subr)&sender);
  local_78._M_pod_data[0] = 0 < sender.m_connections;
  local_50._M_pod_data[0] = 1;
  bVar4 = QTest::qCompare<bool,bool>
                    ((bool *)local_78._M_pod_data,(bool *)local_50._M_pod_data,
                     "sender.hasConnections()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                     ,0x4f);
  if (bVar4) {
    bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                      (&(p.super_QPromiseBase<int>.m_d.d)->
                        super_PromiseDataBase<int,_void_(const_int_&)>);
    local_78._M_pod_data[0] = bVar4;
    local_50._M_pod_data[0] = 1;
    reject = 
    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
    ;
    bVar4 = QTest::qCompare<bool,bool>
                      ((bool *)local_78._M_pod_data,(bool *)local_50._M_pod_data,"p.isPending()",
                       "true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                       ,0x50);
    if (bVar4) {
      value = -1;
      local_c0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001276e0;
      this_01 = (PromiseData<void> *)operator_new(0x58);
      (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
      (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
      (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
      (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
      (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
      (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
           (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
      *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_lock = 0;
      *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_settled = 0;
      (this_01->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
      *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
      (this_01->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object =
           (void *)0x0;
      QtPromisePrivate::PromiseData<void>::PromiseData(this_01);
      LOCK();
      pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
      (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
      if (this_01 != (PromiseData<void> *)0x0) {
        LOCK();
        pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
        (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int>._M_i =
             (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_88._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127770;
      local_c0.m_d.d = this_01;
      local_88.m_d.d = this_01;
      QtPromisePrivate::PromiseResolver<void>::PromiseResolver
                (&resolver,(QPromise<void> *)&local_88);
      QtPromise::QPromiseBase<void>::~QPromiseBase(&local_88);
      QVar2 = p.super_QPromiseBase<int>.m_d;
      if (resolver.m_d.d == (Data *)0x0) {
        resolver.m_d.d =
             (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
             (Data *)0x0;
      }
      else {
        LOCK();
        *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
        UNLOCK();
      }
      local_a0.d = (Data *)0x0;
      if (resolver.m_d.d == (Data *)0x0) {
        local_a8.d = (Data *)0x0;
      }
      else {
        LOCK();
        (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        local_a8 = resolver.m_d.d;
      }
      local_b0.d = (Data *)0x0;
      if (resolver.m_d.d != (Data *)0x0) {
        LOCK();
        (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      if (local_a8.d != (Data *)0x0) {
        LOCK();
        ((local_a8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      local_40 = &value;
      local_78._M_unused._M_object = (Data *)0x0;
      local_78._8_8_ = (QThread *)0x0;
      local_68 = (_Manager_type)0x0;
      p_Stack_60 = (_Invoker_type)0x0;
      local_d8 = resolver.m_d.d;
      local_50._M_unused._0_8_ = resolver.m_d.d;
      local_50._8_8_ = local_a8.d;
      local_78._M_unused._M_object = operator_new(0x18);
      *(void **)local_78._M_unused._0_8_ = local_50._M_unused._M_object;
      if ((Data *)local_50._M_unused._0_8_ != (Data *)0x0) {
        LOCK();
        *(int *)local_50._M_unused._0_8_ = *local_50._M_unused._M_object + 1;
        UNLOCK();
      }
      *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_50._8_8_;
      if ((Data *)local_50._8_8_ != (Data *)0x0) {
        LOCK();
        *(int *)local_50._8_8_ = *(int *)local_50._8_8_ + 1;
        UNLOCK();
      }
      *(int **)((long)local_78._M_unused._0_8_ + 0x10) = local_40;
      p_Stack_60 = std::
                   _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:254:16)>
                 ::_M_manager;
      QtPromisePrivate::
      PromiseHandler<int,waitForValue<int>(QtPromise::QPromise<int>const&,int_const&)::{lambda(int_const&)#1}(int_const&)#1},int_const&>
      ::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(waitForValue<int>(QtPromise::QPromise<int>const&,int_const&)::{lambda(int_const&)#1}(int_const&)#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
      ::{lambda(int_const&)#1}::~function((_lambda_int_const___1_ *)local_50._M_pod_data);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
                (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_int_&)> *)&local_78);
      std::_Function_base::~_Function_base((_Function_base *)&local_78);
      QVar2 = p.super_QPromiseBase<int>.m_d;
      QtPromisePrivate::PromiseCatcher<int,decltype(nullptr),void>::
      create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
                ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
                 (PromiseCatcher<int,decltype(nullptr),void> *)0x0,&local_d8,
                 (QPromiseResolve<void> *)&local_a8,(QPromiseReject<void> *)reject);
      QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
                (&(QVar2.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
                 (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
      std::_Function_base::~_Function_base((_Function_base *)&local_50);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&local_a8);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&local_b0);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&local_d8);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&local_a0);
      QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
      ~QExplicitlySharedDataPointer(&resolver.m_d);
      local_c0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00127770;
      bVar4 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                        (&(p.super_QPromiseBase<int>.m_d.d)->
                          super_PromiseDataBase<int,_void_(const_int_&)>);
      if (!bVar4) {
        QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
                  (&(p.super_QPromiseBase<int>.m_d.d)->
                    super_PromiseDataBase<int,_void_(const_int_&)>);
      }
      QtPromise::QPromiseBase<void>::wait(&local_88,&local_c0);
      QtPromise::QPromiseBase<void>::~QPromiseBase(&local_88);
      QtPromise::QPromiseBase<void>::~QPromiseBase(&local_c0);
      cVar3 = QTest::qCompare(value,0x2a,"waitForValue(p, -1)","42",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                              ,0x51);
      if (cVar3 != '\0') {
        local_88._vptr_QPromiseBase =
             (_func_int **)CONCAT71(local_88._vptr_QPromiseBase._1_7_,0 < sender.m_connections);
        local_c0._vptr_QPromiseBase =
             (_func_int **)((ulong)local_c0._vptr_QPromiseBase & 0xffffffffffffff00);
        QTest::qCompare<bool,bool>
                  ((bool *)&local_88,(bool *)&local_c0,"sender.hasConnections()","false",
                   "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/helpers/tst_connect.cpp"
                   ,0x52);
      }
    }
  }
  QtPromise::QPromiseBase<int>::~QPromiseBase(&p.super_QPromiseBase<int>);
  QObject::~QObject(&sender.super_QObject);
  return;
}

Assistant:

void tst_helpers_connect::resolveOneSenderManyArgs()
{
    Object sender;
    QtPromisePrivate::qtpromise_defer([&]() {
        Q_EMIT sender.twoArgsSignal(42, "foo");
    });

    auto p = QtPromise::connect(&sender, &Object::twoArgsSignal);
    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<int>>::value));
    QCOMPARE(sender.hasConnections(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForValue(p, -1), 42);
    QCOMPARE(sender.hasConnections(), false);
}